

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

pair<int,_int> __thiscall
GameEngine::getDestinationPos(GameEngine *this,shared_ptr<Population> *tempPopulation)

{
  int iVar1;
  int32_t iVar2;
  element_type *peVar3;
  RandomGenerator *pRVar4;
  element_type *peVar5;
  size_t sVar6;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar7;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  element_type *peVar9;
  pair<int,_int> pVar10;
  int local_30;
  int local_2c;
  int32_t dY;
  int32_t dX;
  int32_t yPos;
  int32_t xPos;
  shared_ptr<Population> *tempPopulation_local;
  GameEngine *this_local;
  
  _yPos = tempPopulation;
  tempPopulation_local = (shared_ptr<Population> *)this;
  peVar3 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      tempPopulation);
  dX = Population::GetXPos(peVar3);
  peVar3 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      tempPopulation);
  dY = Population::GetYPos(peVar3);
  pRVar4 = RandomGenerator::getInstance();
  local_2c = RandomGenerator::randInt(pRVar4,-1,1);
  pRVar4 = RandomGenerator::getInstance();
  local_30 = RandomGenerator::randInt(pRVar4,-1,1);
  if (dY + local_30 < 0) {
    local_30 = 1;
  }
  iVar1 = dY + 1;
  peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  sVar6 = Map::getHeight(peVar5);
  if (sVar6 <= (ulong)(long)iVar1) {
    local_30 = -1;
  }
  if (local_30 != 0) {
    if (dY % 2 == 1) {
      pRVar4 = RandomGenerator::getInstance();
      local_2c = RandomGenerator::randInt(pRVar4,0,1);
    }
    else {
      pRVar4 = RandomGenerator::getInstance();
      local_2c = RandomGenerator::randInt(pRVar4,-1,0);
    }
  }
  if (dX + local_2c < 0) {
LAB_001a073d:
    local_2c = 0;
  }
  else {
    iVar1 = dX + local_2c;
    peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    sVar6 = Map::getWidth(peVar5);
    if (sVar6 <= (ulong)(long)iVar1) goto LAB_001a073d;
  }
  peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  pvVar7 = Map::operator[](peVar5,(long)(dY + local_30));
  p_Var8 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
           operator[](pvVar7,(long)(dX + local_2c));
  peVar9 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var8);
  iVar2 = CellType::getCarnivoreCount(peVar9);
  if (iVar2 < 1) {
    peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    pvVar7 = Map::operator[](peVar5,(long)(dY + local_30));
    p_Var8 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
             operator[](pvVar7,(long)(dX + local_2c));
    peVar9 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var8);
    iVar2 = CellType::getHerbivoreCount(peVar9);
    if (iVar2 < 1) goto LAB_001a07d2;
  }
  local_2c = 0;
  local_30 = 0;
LAB_001a07d2:
  pVar10 = std::make_pair<int&,int&>(&local_2c,&local_30);
  return pVar10;
}

Assistant:

std::pair<int32_t, int32_t> GameEngine::getDestinationPos(std::shared_ptr<Population> tempPopulation) {
  int32_t xPos = tempPopulation->GetXPos();
  int32_t yPos = tempPopulation->GetYPos();
  int32_t dX = RandomGenerator::getInstance().randInt(-1, 1);
  int32_t dY = RandomGenerator::getInstance().randInt(-1, 1);
  if (yPos + dY < 0) {
    dY = 1;
  }
  if (yPos + 1 >= map->getHeight()) {
    dY = -1;
  }
  if (dY != 0) {
    if (yPos % 2 == 1) {
      dX = RandomGenerator::getInstance().randInt(0, 1);
    } else {
      dX = RandomGenerator::getInstance().randInt(-1, 0);
    }
  }
  if (xPos + dX < 0 || xPos + dX >= map->getWidth()) {
    dX = 0;
  }
  if ((*map)[yPos + dY][xPos + dX]->getCarnivoreCount() > 0 || (*map)[yPos + dY][xPos + dX]->getHerbivoreCount() > 0) {
    dX = 0;
    dY = 0;
  }
  return std::make_pair(dX, dY);
}